

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O3

void sylvan_serialize_totext(FILE *out)

{
  ulong uVar1;
  ulong uVar2;
  avl_node_t *paVar3;
  undefined8 in_RAX;
  avl_iter_t *iter;
  sylvan_ser *psVar4;
  long lVar5;
  size_t __size;
  
  fputc(0x5b,(FILE *)out);
  paVar3 = sylvan_ser_reversed_set;
  if (sylvan_ser_reversed_set == (avl_node_t *)0x0) {
    __size = 0x10;
  }
  else {
    __size = (ulong)(sylvan_ser_reversed_set->height + 1) * 8 + 8;
  }
  iter = (avl_iter_t *)malloc(__size);
  iter->height = 0;
  iter[1].height = (size_t)paVar3;
  psVar4 = sylvan_ser_reversed_iter_next(iter);
  while (psVar4 != (sylvan_ser *)0x0) {
    lVar5 = (psVar4->bdd & 0xffffffffff) * 0x10;
    uVar1 = *(ulong *)(nodes->data + lVar5);
    uVar2 = *(ulong *)(nodes->data + lVar5 + 8);
    in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),(uint)(uVar1 >> 0x3f));
    fprintf((FILE *)out,"(%zu,%u,%zu,%zu,%u),",psVar4->assigned,uVar2 >> 0x28,uVar2 & 0xffffffffff,
            uVar1 & 0xffffffffff,in_RAX);
    psVar4 = sylvan_ser_reversed_iter_next(iter);
  }
  free(iter);
  fputc(0x5d,(FILE *)out);
  return;
}

Assistant:

void
sylvan_serialize_totext(FILE *out)
{
    fprintf(out, "[");
    avl_iter_t *it = sylvan_ser_reversed_iter(sylvan_ser_reversed_set);
    struct sylvan_ser *s;

    while ((s=sylvan_ser_reversed_iter_next(it))) {
        BDD bdd = s->bdd;
        bddnode_t n = MTBDD_GETNODE(bdd);
        fprintf(out, "(%zu,%u,%zu,%zu,%u),", s->assigned,
                                             bddnode_getvariable(n),
                                             (size_t)bddnode_getlow(n),
                                             (size_t)BDD_STRIPMARK(bddnode_gethigh(n)),
                                             BDD_HASMARK(bddnode_gethigh(n)) ? 1 : 0);
    }

    sylvan_ser_reversed_iter_free(it);
    fprintf(out, "]");
}